

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteEncoderPreload(AmpIO *this,uint index,int32_t sdata)

{
  BasePort *pBVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  bool local_25;
  bool ret;
  uint channel;
  int32_t sdata_local;
  uint index_local;
  AmpIO *this_local;
  
  if ((sdata < 0x800000) && (-0x800001 < sdata)) {
    local_25 = false;
    if (((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) && (index < this->NumEncoders))
    {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar2 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)((index + 1) * 0x10 | 4),(ulong)(sdata + 0x800000));
      local_25 = (bool)((byte)iVar2 & 1);
    }
    this_local._7_1_ = local_25;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "AmpIO::WriteEncoderPreload, preload out of range ");
    this_01 = (void *)std::ostream::operator<<(this_00,sdata);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteEncoderPreload(unsigned int index, int32_t sdata)
{
    unsigned int channel = (index+1) << 4;

    if ((sdata >= ENC_MIDRANGE) || (sdata < -ENC_MIDRANGE)) {
        std::cerr << "AmpIO::WriteEncoderPreload, preload out of range " << sdata << std::endl;
        return false;
    }
    bool ret = false;
    if (port && (index < NumEncoders)) {
        ret = port->WriteQuadlet(BoardId, channel | ENC_LOAD_REG,
                                 static_cast<uint32_t>(sdata + ENC_MIDRANGE));
    }
    return ret;
}